

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O2

int Ivy_ManCheckFanouts(Ivy_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *vArray;
  void **ppvVar2;
  uint *puVar3;
  uint *puVar4;
  Ivy_Obj_t *pIVar5;
  int iVar6;
  Vec_Ptr_t *p_00;
  int iVar7;
  int iVar8;
  
  if (p->fFanout == 0) {
    iVar6 = 1;
  }
  else {
    vArray = (Vec_Ptr_t *)malloc(0x10);
    vArray->nCap = 100;
    vArray->nSize = 0;
    ppvVar2 = (void **)malloc(800);
    vArray->pArray = ppvVar2;
    iVar6 = 1;
    iVar8 = 0;
    while( true ) {
      p_00 = p->vObjs;
      iVar7 = p_00->nSize;
      if (iVar7 <= iVar8) break;
      puVar3 = (uint *)Vec_PtrEntry(p_00,iVar8);
      if ((puVar3 != (uint *)0x0) &&
         (pIVar5 = (Ivy_Obj_t *)(*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe),
         pIVar5 != (Ivy_Obj_t *)0x0)) {
        Ivy_ObjCollectFanouts(p,pIVar5,vArray);
        iVar7 = 0;
        while( true ) {
          iVar1 = vArray->nSize;
          if (iVar1 <= iVar7) break;
          puVar4 = (uint *)Vec_PtrEntry(vArray,iVar7);
          if ((puVar4 == (uint *)0x0) || (puVar4 == puVar3)) {
            iVar1 = vArray->nSize;
            break;
          }
          iVar7 = iVar7 + 1;
        }
        if (iVar1 == iVar7) {
          iVar6 = 0;
          printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                 (ulong)(uint)pIVar5->Id,(ulong)*puVar3);
        }
        pIVar5 = (Ivy_Obj_t *)(*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe);
        if (pIVar5 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjCollectFanouts(p,pIVar5,vArray);
          iVar7 = 0;
          while( true ) {
            iVar1 = vArray->nSize;
            if (iVar1 <= iVar7) break;
            puVar4 = (uint *)Vec_PtrEntry(vArray,iVar7);
            if ((puVar4 == (uint *)0x0) || (puVar4 == puVar3)) {
              iVar1 = vArray->nSize;
              break;
            }
            iVar7 = iVar7 + 1;
          }
          if (iVar1 == iVar7) {
            iVar6 = 0;
            printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                   (ulong)(uint)pIVar5->Id,(ulong)*puVar3);
          }
          puVar4 = *(uint **)(puVar3 + 0xe);
          if (puVar4 != (uint *)0x0) {
            if (((((*(ulong *)(puVar4 + 4) & 0xfffffffffffffffe) !=
                   (*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe)) &&
                 ((*(ulong *)(puVar4 + 4) & 0xfffffffffffffffe) !=
                  (*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe))) &&
                ((*(ulong *)(puVar4 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe))) &&
               ((*(ulong *)(puVar4 + 6) & 0xfffffffffffffffe) !=
                (*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe))) {
              iVar6 = 0;
              printf("Node %d has prev %d without common fanin.\n",(ulong)*puVar3,(ulong)*puVar4);
            }
          }
          puVar4 = *(uint **)(puVar3 + 0x10);
          if (puVar4 != (uint *)0x0) {
            if ((((*(ulong *)(puVar4 + 4) & 0xfffffffffffffffe) !=
                  (*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe)) &&
                ((*(ulong *)(puVar4 + 4) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe))) &&
               (((*(ulong *)(puVar4 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe) &&
                ((*(ulong *)(puVar4 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe))))) {
              iVar6 = 0;
              printf("Node %d has prev %d without common fanin.\n",(ulong)*puVar3,(ulong)*puVar4);
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
    }
    for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 1) {
      pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(p_00,iVar8);
      if (pIVar5 != (Ivy_Obj_t *)0x0) {
        Ivy_ObjCollectFanouts(p,pIVar5,vArray);
        for (iVar7 = 0; iVar7 < vArray->nSize; iVar7 = iVar7 + 1) {
          puVar3 = (uint *)Vec_PtrEntry(vArray,iVar7);
          if (puVar3 == (uint *)0x0) break;
          if ((pIVar5 != (Ivy_Obj_t *)(*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe)) &&
             (pIVar5 != (Ivy_Obj_t *)(*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe))) {
            iVar6 = 0;
            printf("Node %d is a fanout of node %d but the fanin is not there.\n",(ulong)*puVar3,
                   (ulong)(uint)pIVar5->Id);
          }
        }
      }
      p_00 = p->vObjs;
      iVar7 = p_00->nSize;
    }
    free(vArray->pArray);
    free(vArray);
  }
  return iVar6;
}

Assistant:

int Ivy_ManCheckFanouts( Ivy_Man_t * p )
{
    Vec_Ptr_t * vFanouts;
    Ivy_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, RetValue = 1;
    if ( !p->fFanout )
        return 1;
    vFanouts = Vec_PtrAlloc( 100 );
    // make sure every fanin is a fanout
    Ivy_ManForEachObj( p, pObj, i )
    {
        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan0 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan0->Id );
                RetValue = 0;
            }
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan1 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan1->Id );
                RetValue = 0;
            }
        }
    }
    // make sure every fanout is a fanin
    Ivy_ManForEachObj( p, pObj, i )
    {
        Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, k )
            if ( Ivy_ObjFanin0(pFanout) != pObj && Ivy_ObjFanin1(pFanout) != pObj )
            {
                printf( "Node %d is a fanout of node %d but the fanin is not there.\n", pFanout->Id, pObj->Id );
                RetValue = 0;
            }
    }
    Vec_PtrFree( vFanouts );
    return RetValue;
}